

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O1

immutable_string __thiscall
ut::test_case_impl<agge::tests::ScanlineAdapterTests>::fixture_name
          (test_case_impl<agge::tests::ScanlineAdapterTests> *this)

{
  _func_int **__dest;
  DeleterF extraout_RDX;
  DeleterF extraout_RDX_00;
  DeleterF extraout_RDX_01;
  DeleterF p_Var1;
  immutable_string iVar2;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ScanlineAdapterTests","");
  __dest = (_func_int **)operator_new__(local_38 + 1);
  (this->super_test_case).super_destructible._vptr_destructible = __dest;
  p_Var1 = extraout_RDX;
  if (local_38 != 0) {
    memmove(__dest,local_40,local_38);
    p_Var1 = extraout_RDX_00;
  }
  *(undefined1 *)((long)__dest + local_38) = 0;
  this->_method = (method_t)exportable::immutable_basic_string<char>::deallocate;
  if (local_40 != local_30) {
    operator_delete(local_40);
    p_Var1 = extraout_RDX_01;
  }
  iVar2._deleter = p_Var1;
  iVar2._text = (char *)this;
  return iVar2;
}

Assistant:

inline exportable::immutable_string test_case_impl<Fixture>::fixture_name() const
	{	return std::string(Fixture::__suite_name());	}